

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

aiMesh * Assimp::StandardShapes::MakeMesh
                   (uint num,
                   _func_void_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr
                   *GenerateFunc)

{
  aiMesh *paVar1;
  undefined1 local_30 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp;
  _func_void_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr
  *GenerateFunc_local;
  uint num_local;
  
  temp.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)GenerateFunc;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  (*(code *)temp.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)
            (num,(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  paVar1 = MakeMesh((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,3);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  return paVar1;
}

Assistant:

aiMesh* StandardShapes::MakeMesh (unsigned int num,  void (*GenerateFunc)(
    unsigned int,std::vector<aiVector3D>&))
{
    std::vector<aiVector3D> temp;
    (*GenerateFunc)(num,temp);
    return MakeMesh(temp,3);
}